

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O0

void __thiscall
Outputs::Display::BufferingScanTarget::perform
          (BufferingScanTarget *this,function<void_()> *function)

{
  __atomic_flag_data_type _Var1;
  function<void_()> *function_local;
  BufferingScanTarget *this_local;
  memory_order __b;
  
  do {
    LOCK();
    _Var1 = (this->is_updating_).super___atomic_flag_base._M_i;
    (this->is_updating_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  std::function<void_()>::operator()(function);
  std::operator&(memory_order_release,__memory_order_mask);
  (this->is_updating_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void BufferingScanTarget::perform(const std::function<void(void)> &function) {
	while(is_updating_.test_and_set(std::memory_order_acquire));
	function();
	is_updating_.clear(std::memory_order_release);
}